

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genLoadRelationFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  pointer pcVar1;
  string *psVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_t sVar5;
  TDNode *pTVar6;
  ulong *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  string returnString;
  string rel_name;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  ulong *local_480;
  long local_478;
  ulong local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  long lStack_3c8;
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0;
  long lStack_3a8;
  ulong *local_3a0;
  long local_398;
  ulong local_390;
  undefined8 uStack_388;
  ulong *local_380;
  long local_378;
  ulong local_370;
  long lStack_368;
  ulong *local_360;
  long local_358;
  ulong local_350;
  undefined8 uStack_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  CppGenerator *local_320;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  ulong *local_298;
  long local_290;
  ulong local_288;
  long lStack_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  undefined8 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_278 = &local_268;
  local_320 = this;
  std::__cxx11::string::_M_construct((ulong)&local_278,'\x03');
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_3e0 = &local_3d0;
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_3d0 = *puVar7;
    lStack_3c8 = plVar3[3];
  }
  else {
    local_3d0 = *puVar7;
    local_3e0 = (ulong *)*plVar3;
  }
  local_3d8 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_3a0 = &local_390;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x03');
  uVar13 = 0xf;
  if (local_3e0 != &local_3d0) {
    uVar13 = local_3d0;
  }
  if (uVar13 < (ulong)(local_398 + local_3d8)) {
    uVar13 = 0xf;
    if (local_3a0 != &local_390) {
      uVar13 = local_390;
    }
    if (uVar13 < (ulong)(local_398 + local_3d8)) goto LAB_00220570;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_3e0);
  }
  else {
LAB_00220570:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_3a0);
  }
  local_340 = &local_330;
  puVar9 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar9) {
    local_330 = *puVar9;
    uStack_328 = puVar4[3];
  }
  else {
    local_330 = *puVar9;
    local_340 = (undefined8 *)*puVar4;
  }
  local_338 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_340);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_370 = *puVar7;
    lStack_368 = plVar3[3];
    local_380 = &local_370;
  }
  else {
    local_370 = *puVar7;
    local_380 = (ulong *)*plVar3;
  }
  local_378 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_3c0 = &local_3b0;
  std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x06');
  uVar13 = 0xf;
  if (local_380 != &local_370) {
    uVar13 = local_370;
  }
  if (uVar13 < (ulong)(local_3b8 + local_378)) {
    uVar13 = 0xf;
    if (local_3c0 != &local_3b0) {
      uVar13 = local_3b0;
    }
    if (uVar13 < (ulong)(local_3b8 + local_378)) goto LAB_002206ca;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_380);
  }
  else {
LAB_002206ca:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_3c0);
  }
  local_440 = &local_430;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_430 = *plVar3;
    lStack_428 = puVar4[3];
  }
  else {
    local_430 = *plVar3;
    local_440 = (long *)*puVar4;
  }
  local_438 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_480 = &local_470;
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_470 = *puVar7;
    lStack_468 = plVar3[3];
  }
  else {
    local_470 = *puVar7;
    local_480 = (ulong *)*plVar3;
  }
  local_478 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_360 = &local_350;
  std::__cxx11::string::_M_construct((ulong)&local_360,'\x06');
  uVar13 = 0xf;
  if (local_480 != &local_470) {
    uVar13 = local_470;
  }
  if (uVar13 < (ulong)(local_358 + local_478)) {
    uVar13 = 0xf;
    if (local_360 != &local_350) {
      uVar13 = local_350;
    }
    if ((ulong)(local_358 + local_478) <= uVar13) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_480);
      goto LAB_00220822;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_360);
LAB_00220822:
  local_460 = &local_450;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_450 = *plVar3;
    lStack_448 = puVar4[3];
  }
  else {
    local_450 = *plVar3;
    local_460 = (long *)*puVar4;
  }
  local_458 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_4a0 = &local_490;
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_490 = *plVar8;
    lStack_488 = plVar3[3];
  }
  else {
    local_490 = *plVar8;
    local_4a0 = (long *)*plVar3;
  }
  local_498 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  local_58 = __return_storage_ptr__;
  if (local_278 != &local_268) {
    operator_delete(local_278);
  }
  uVar13 = 0;
  do {
    sVar5 = TreeDecomposition::numberOfRelations
                      ((local_320->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar5 <= uVar13) {
      std::__cxx11::string::append((char *)&local_4a0);
      lVar11 = 8;
      uVar13 = 0;
      while( true ) {
        sVar5 = QueryCompiler::numberOfViews
                          ((local_320->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (sVar5 <= uVar13) break;
        local_440 = &local_430;
        std::__cxx11::string::_M_construct((ulong)&local_440,'\x06');
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_440,*(ulong *)((long)local_320->viewName + lVar11 + -8));
        local_480 = &local_470;
        puVar7 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar7) {
          local_470 = *puVar7;
          lStack_468 = puVar4[3];
        }
        else {
          local_470 = *puVar7;
          local_480 = (ulong *)*puVar4;
        }
        local_478 = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
        local_460 = &local_450;
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_450 = *plVar3;
          lStack_448 = puVar4[3];
        }
        else {
          local_450 = *plVar3;
          local_460 = (long *)*puVar4;
        }
        local_458 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_460);
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x20;
      }
      local_480 = &local_470;
      std::__cxx11::string::_M_construct((ulong)&local_480,'\x03');
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_480,0,(char *)0x0,(ulong)local_4a0);
      psVar2 = local_58;
      local_460 = &local_450;
      plVar8 = plVar3 + 2;
      if ((long *)*plVar3 == plVar8) {
        local_450 = *plVar8;
        lStack_448 = plVar3[3];
      }
      else {
        local_450 = *plVar8;
        local_460 = (long *)*plVar3;
      }
      local_458 = plVar3[1];
      *plVar3 = (long)plVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_460);
      (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
      psVar10 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar10) {
        lVar11 = plVar3[3];
        (psVar2->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&psVar2->field_2 + 8) = lVar11;
      }
      else {
        (psVar2->_M_dataplus)._M_p = (pointer)*plVar3;
        (psVar2->field_2)._M_allocated_capacity = *psVar10;
      }
      psVar2->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar10;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_460 != &local_450) {
        operator_delete(local_460);
      }
      if (local_480 != &local_470) {
        operator_delete(local_480);
      }
      if (local_4a0 != &local_490) {
        operator_delete(local_4a0);
      }
      return psVar2;
    }
    pTVar6 = TreeDecomposition::getRelation
                       ((local_320->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar13);
    local_460 = &local_450;
    pcVar1 = (pTVar6->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar1,pcVar1 + (pTVar6->_name)._M_string_length);
    local_340 = &local_330;
    std::__cxx11::string::_M_construct((ulong)&local_340,'\x06');
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,0x2b2de1);
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_370 = *puVar7;
      lStack_368 = puVar4[3];
      local_380 = &local_370;
    }
    else {
      local_370 = *puVar7;
      local_380 = (ulong *)*puVar4;
    }
    local_378 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_460);
    local_440 = &local_430;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_430 = *plVar8;
      lStack_428 = plVar3[3];
    }
    else {
      local_430 = *plVar8;
      local_440 = (long *)*plVar3;
    }
    local_438 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_440);
    local_480 = &local_470;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_470 = *puVar7;
      lStack_468 = plVar3[3];
    }
    else {
      local_470 = *puVar7;
      local_480 = (ulong *)*plVar3;
    }
    local_478 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_480);
    if (local_480 != &local_470) {
      operator_delete(local_480);
    }
    if (local_440 != &local_430) {
      operator_delete(local_440);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    local_420 = &local_410;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_410 = *plVar8;
      lStack_408 = plVar3[3];
    }
    else {
      local_410 = *plVar8;
      local_420 = (long *)*plVar3;
    }
    local_418 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_460);
    local_d8 = &local_c8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_c8 = *plVar8;
      lStack_c0 = plVar3[3];
    }
    else {
      local_c8 = *plVar8;
      local_d8 = (long *)*plVar3;
    }
    local_d0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_318 = &local_308;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_308 = *puVar7;
      lStack_300 = plVar3[3];
    }
    else {
      local_308 = *puVar7;
      local_318 = (ulong *)*plVar3;
    }
    local_310 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\x06');
    uVar12 = 0xf;
    if (local_318 != &local_308) {
      uVar12 = local_308;
    }
    if (uVar12 < (ulong)(local_f0 + local_310)) {
      uVar12 = 0xf;
      if (local_f8 != local_e8) {
        uVar12 = local_e8[0];
      }
      if (uVar12 < (ulong)(local_f0 + local_310)) goto LAB_00220db8;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_318);
    }
    else {
LAB_00220db8:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_f8);
    }
    local_400 = &local_3f0;
    puVar9 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar9) {
      local_3f0 = *puVar9;
      uStack_3e8 = puVar4[3];
    }
    else {
      local_3f0 = *puVar9;
      local_400 = (undefined8 *)*puVar4;
    }
    local_3f8 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)puVar9 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_400);
    local_2f8 = &local_2e8;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_2e8 = *puVar7;
      lStack_2e0 = plVar3[3];
    }
    else {
      local_2e8 = *puVar7;
      local_2f8 = (ulong *)*plVar3;
    }
    local_2f0 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_118 = local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
    uVar12 = 0xf;
    if (local_2f8 != &local_2e8) {
      uVar12 = local_2e8;
    }
    if (uVar12 < (ulong)(local_110 + local_2f0)) {
      uVar12 = 0xf;
      if (local_118 != local_108) {
        uVar12 = local_108[0];
      }
      if (uVar12 < (ulong)(local_110 + local_2f0)) goto LAB_00220f26;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_2f8);
    }
    else {
LAB_00220f26:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_118);
    }
    local_258 = &local_248;
    puVar9 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar9) {
      local_248 = *puVar9;
      uStack_240 = puVar4[3];
    }
    else {
      local_248 = *puVar9;
      local_258 = (undefined8 *)*puVar4;
    }
    local_250 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)puVar9 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_2d8 = &local_2c8;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_2c8 = *puVar7;
      lStack_2c0 = plVar3[3];
    }
    else {
      local_2c8 = *puVar7;
      local_2d8 = (ulong *)*plVar3;
    }
    local_2d0 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_138 = local_128;
    std::__cxx11::string::_M_construct((ulong)&local_138,'\t');
    uVar12 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar12 = local_2c8;
    }
    if (uVar12 < (ulong)(local_130 + local_2d0)) {
      uVar12 = 0xf;
      if (local_138 != local_128) {
        uVar12 = local_128[0];
      }
      if (uVar12 < (ulong)(local_130 + local_2d0)) goto LAB_00221094;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_00221094:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_138);
    }
    local_238 = &local_228;
    puVar9 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar9) {
      local_228 = *puVar9;
      uStack_220 = puVar4[3];
    }
    else {
      local_228 = *puVar9;
      local_238 = (undefined8 *)*puVar4;
    }
    local_230 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)puVar9 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_b8 = &local_a8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_a8 = *plVar8;
      lStack_a0 = plVar3[3];
    }
    else {
      local_a8 = *plVar8;
      local_b8 = (long *)*plVar3;
    }
    local_b0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_460);
    local_98 = &local_88;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_88 = *plVar8;
      lStack_80 = plVar3[3];
    }
    else {
      local_88 = *plVar8;
      local_98 = (long *)*plVar3;
    }
    local_90 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_2b8 = &local_2a8;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_2a8 = *puVar7;
      lStack_2a0 = plVar3[3];
    }
    else {
      local_2a8 = *puVar7;
      local_2b8 = (ulong *)*plVar3;
    }
    local_2b0 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_158 = local_148;
    std::__cxx11::string::_M_construct((ulong)&local_158,'\t');
    uVar12 = 0xf;
    if (local_2b8 != &local_2a8) {
      uVar12 = local_2a8;
    }
    if (uVar12 < (ulong)(local_150 + local_2b0)) {
      uVar12 = 0xf;
      if (local_158 != local_148) {
        uVar12 = local_148[0];
      }
      if (uVar12 < (ulong)(local_150 + local_2b0)) goto LAB_002212d7;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_2b8);
    }
    else {
LAB_002212d7:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_158);
    }
    local_218 = &local_208;
    puVar9 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar9) {
      local_208 = *puVar9;
      uStack_200 = puVar4[3];
    }
    else {
      local_208 = *puVar9;
      local_218 = (undefined8 *)*puVar4;
    }
    local_210 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)puVar9 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_298 = &local_288;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_288 = *puVar7;
      lStack_280 = plVar3[3];
    }
    else {
      local_288 = *puVar7;
      local_298 = (ulong *)*plVar3;
    }
    local_290 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_178 = local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
    uVar12 = 0xf;
    if (local_298 != &local_288) {
      uVar12 = local_288;
    }
    if (uVar12 < (ulong)(local_170 + local_290)) {
      uVar12 = 0xf;
      if (local_178 != local_168) {
        uVar12 = local_168[0];
      }
      if (uVar12 < (ulong)(local_170 + local_290)) goto LAB_00221445;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_298);
    }
    else {
LAB_00221445:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_178);
    }
    local_1f8 = &local_1e8;
    puVar9 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar9) {
      local_1e8 = *puVar9;
      uStack_1e0 = puVar4[3];
    }
    else {
      local_1e8 = *puVar9;
      local_1f8 = (undefined8 *)*puVar4;
    }
    local_1f0 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)puVar9 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_68 = *puVar7;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *puVar7;
      local_78 = (ulong *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,'\x06');
    uVar12 = 0xf;
    if (local_78 != &local_68) {
      uVar12 = local_68;
    }
    if (uVar12 < (ulong)(local_190 + local_70)) {
      uVar12 = 0xf;
      if (local_198 != local_188) {
        uVar12 = local_188[0];
      }
      if (uVar12 < (ulong)(local_190 + local_70)) goto LAB_002215a4;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_78);
    }
    else {
LAB_002215a4:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_198);
    }
    local_360 = &local_350;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_350 = *puVar7;
      uStack_348 = puVar4[3];
    }
    else {
      local_350 = *puVar7;
      local_360 = (ulong *)*puVar4;
    }
    local_358 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_360);
    local_3c0 = &local_3b0;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_3b0 = *puVar7;
      lStack_3a8 = plVar3[3];
    }
    else {
      local_3b0 = *puVar7;
      local_3c0 = (ulong *)*plVar3;
    }
    local_3b8 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,'\t');
    uVar12 = 0xf;
    if (local_3c0 != &local_3b0) {
      uVar12 = local_3b0;
    }
    if (uVar12 < (ulong)(local_1b0 + local_3b8)) {
      uVar12 = 0xf;
      if (local_1b8 != local_1a8) {
        uVar12 = local_1a8[0];
      }
      if (uVar12 < (ulong)(local_1b0 + local_3b8)) goto LAB_00221712;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_3c0);
    }
    else {
LAB_00221712:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_1b8);
    }
    local_3a0 = &local_390;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_390 = *puVar7;
      uStack_388 = puVar4[3];
    }
    else {
      local_390 = *puVar7;
      local_3a0 = (ulong *)*puVar4;
    }
    local_398 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_460);
    local_278 = &local_268;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar3[3];
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar3;
    }
    local_270 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
    local_3e0 = &local_3d0;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_3d0 = *puVar7;
      lStack_3c8 = puVar4[3];
    }
    else {
      local_3d0 = *puVar7;
      local_3e0 = (ulong *)*puVar4;
    }
    local_3d8 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_460);
    puVar9 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar9) {
      local_330 = *puVar9;
      uStack_328 = puVar4[3];
      local_340 = &local_330;
    }
    else {
      local_330 = *puVar9;
      local_340 = (undefined8 *)*puVar4;
    }
    local_338 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_370 = *puVar7;
      lStack_368 = puVar4[3];
      local_380 = &local_370;
    }
    else {
      local_370 = *puVar7;
      local_380 = (ulong *)*puVar4;
    }
    local_378 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x06');
    uVar12 = 0xf;
    if (local_380 != &local_370) {
      uVar12 = local_370;
    }
    if (uVar12 < (ulong)(local_1d0 + local_378)) {
      uVar12 = 0xf;
      if (local_1d8 != local_1c8) {
        uVar12 = local_1c8[0];
      }
      if (uVar12 < (ulong)(local_1d0 + local_378)) goto LAB_002219a6;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_380);
    }
    else {
LAB_002219a6:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_1d8);
    }
    local_440 = &local_430;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_430 = *plVar3;
      lStack_428 = puVar4[3];
    }
    else {
      local_430 = *plVar3;
      local_440 = (long *)*puVar4;
    }
    local_438 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
    local_480 = &local_470;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_470 = *puVar7;
      lStack_468 = puVar4[3];
    }
    else {
      local_470 = *puVar7;
      local_480 = (ulong *)*puVar4;
    }
    local_478 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_480);
    if (local_480 != &local_470) {
      operator_delete(local_480);
    }
    if (local_440 != &local_430) {
      operator_delete(local_440);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0);
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0);
    }
    if (local_360 != &local_350) {
      operator_delete(local_360);
    }
    if (local_198 != local_188) {
      operator_delete(local_198);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_178 != local_168) {
      operator_delete(local_178);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_138 != local_128) {
      operator_delete(local_138);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    if (local_118 != local_108) {
      operator_delete(local_118);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    if (local_400 != &local_3f0) {
      operator_delete(local_400);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_420 != &local_410) {
      operator_delete(local_420);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_460 != &local_450) {
      operator_delete(local_460);
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

std::string CppGenerator::genLoadRelationFunction()
{
    std::string returnString = offset(1)+"void loadRelations()\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        std::string rel_name = _td->getRelation(rel)->_name;
        
        returnString += "\n"+offset(2)+rel_name+".clear();\n";

        returnString += offset(2)+"input.open(PATH_TO_DATA + \"/"+rel_name+".tbl\");\n"+
            offset(2)+"if (!input)\n"+offset(2)+"{\n"+
            offset(3)+"std::cerr << PATH_TO_DATA + \""+rel_name+
            ".tbl does is not exist. \\n\";\n"+
            offset(3)+"exit(1);\n"+offset(2)+"}\n"+
            offset(2)+"while(getline(input, line))\n"+
            offset(3)+rel_name+".push_back("+rel_name+"_tuple(line));\n"+
            offset(2)+"input.close();\n";            
    }

    // Reserving space for the views to speed up push tuples to them.
    returnString += "\n";
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        returnString += offset(2)+viewName[viewID]+".reserve(1000000);\n";

    return returnString+offset(1)+"}\n";
}